

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O0

var cs::function::call_el(function *_this,vector *args)

{
  bool bVar1;
  undefined8 uVar2;
  const_reference ppsVar3;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *in_RDX;
  proxy *in_RDI;
  exception *e;
  statement_base *ptr;
  exception *e_1;
  undefined1 in_stack_000007ef;
  iterator *in_stack_000007f0;
  runtime_type *in_stack_000007f8;
  string *in_stack_fffffffffffffea8;
  process_context *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *in_stack_fffffffffffffec0;
  unsigned_long in_stack_fffffffffffffee8;
  
  process_context::poll_event(in_stack_fffffffffffffeb0);
  bVar1 = std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::empty
                    ((vector<cs_impl::any,_std::allocator<cs_impl::any>_> *)
                     in_stack_fffffffffffffec0);
  if (!bVar1) {
    uVar2 = __cxa_allocate_exception(0x28);
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::size(in_RDX);
    std::__cxx11::to_string(in_stack_fffffffffffffee8);
    std::operator+(in_stack_fffffffffffffeb8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffeb0);
    runtime_error::runtime_error
              ((runtime_error *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    __cxa_throw(uVar2,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x5db1dd);
  std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x5db1e9);
  ppsVar3 = std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::front
                      (in_stack_fffffffffffffec0);
  statement_return::get_tree((statement_return *)*ppsVar3);
  tree_type<cs::token_base_*>::root((tree_type<cs::token_base_*> *)in_stack_fffffffffffffea8);
  runtime_type::parse_expr(in_stack_000007f8,in_stack_000007f0,(bool)in_stack_000007ef);
  return (var)in_RDI;
}

Assistant:

var function::call_el(const function *_this, vector &args)
	{
		current_process->poll_event();
		if (!args.empty())
			throw runtime_error("Wrong size of arguments. Expected none, provided " + std::to_string(args.size()));
#ifdef CS_DEBUGGER
		fcall_guard fcall(_this->mDecl);
		if(_this->mMatch)
			cs_debugger_func_callback(_this->mDecl, _this->mStmt);
#endif
		try {
			return _this->mContext->instance->parse_expr(static_cast<const statement_return *>(_this->mBody.front())->get_tree().root());
		}
		catch (const cs::exception &e) {
			throw e;
		}
		catch (const std::exception &e) {
			const statement_base *ptr = _this->mBody.front();
			throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
		}
	}